

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Optimizer::SerializeWithCachedSizes
          (Optimizer *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->OptimizerType_).sgdoptimizer_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0xb) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->OptimizerType_).sgdoptimizer_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void Optimizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Optimizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.SGDOptimizer sgdOptimizer = 10;
  if (has_sgdoptimizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *OptimizerType_.sgdoptimizer_, output);
  }

  // .CoreML.Specification.AdamOptimizer adamOptimizer = 11;
  if (has_adamoptimizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *OptimizerType_.adamoptimizer_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Optimizer)
}